

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O2

void __thiscall cmSourceFileLocation::UpdateExtension(cmSourceFileLocation *this,string *name)

{
  cmMakefile *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  cmGlobalGenerator *this_00;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  string tryPath;
  string ext;
  string local_40;
  
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmSourceFileLocation.cxx"
                  ,0x75,"void cmSourceFileLocation::UpdateExtension(const std::string &)");
  }
  cmsys::SystemTools::GetFilenameLastExtension(&ext,name);
  if (ext._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&tryPath,(ulong)&ext);
    std::__cxx11::string::operator=((string *)&ext,(string *)&tryPath);
    std::__cxx11::string::~string((string *)&tryPath);
  }
  this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
  pcVar1 = this->Makefile;
  cmGlobalGenerator::GetLanguageFromExtension_abi_cxx11_(&tryPath,this_00,ext._M_dataplus._M_p);
  if (tryPath._M_string_length == 0) {
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((pcVar1->SourceFileExtensions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pcVar1->SourceFileExtensions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&ext);
    if (_Var4._M_current !=
        (pcVar1->SourceFileExtensions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0037cc03;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((pcVar1->HeaderFileExtensions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pcVar1->HeaderFileExtensions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&ext);
    pbVar2 = (pcVar1->HeaderFileExtensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::~string((string *)&tryPath);
    if (_Var4._M_current == pbVar2) {
      tryPath._M_dataplus._M_p = (pointer)&tryPath.field_2;
      tryPath._M_string_length = 0;
      tryPath.field_2._M_local_buf[0] = '\0';
      if (this->AmbiguousDirectory == true) {
        cmMakefile::GetCurrentSourceDirectory(this->Makefile);
        std::__cxx11::string::assign((char *)&tryPath);
        std::__cxx11::string::append((char *)&tryPath);
      }
      if ((this->Directory)._M_string_length != 0) {
        std::__cxx11::string::append((string *)&tryPath);
        std::__cxx11::string::append((char *)&tryPath);
      }
      std::__cxx11::string::append((string *)&tryPath);
      bVar3 = cmsys::SystemTools::FileExists(tryPath._M_dataplus._M_p,true);
      if (bVar3) {
        cmsys::SystemTools::GetFilenameName(&local_40,name);
        std::__cxx11::string::operator=((string *)&this->Name,(string *)&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        this->AmbiguousExtension = false;
        if (this->AmbiguousDirectory == true) {
          DirectoryUseSource(this);
        }
      }
      std::__cxx11::string::~string((string *)&tryPath);
      goto LAB_0037cc37;
    }
  }
  else {
LAB_0037cc03:
    std::__cxx11::string::~string((string *)&tryPath);
  }
  cmsys::SystemTools::GetFilenameName(&tryPath,name);
  std::__cxx11::string::operator=((string *)&this->Name,(string *)&tryPath);
  std::__cxx11::string::~string((string *)&tryPath);
  this->AmbiguousExtension = false;
LAB_0037cc37:
  std::__cxx11::string::~string((string *)&ext);
  return;
}

Assistant:

void cmSourceFileLocation::UpdateExtension(const std::string& name)
{
  assert(this->Makefile);
  // Check the extension.
  std::string ext = cmSystemTools::GetFilenameLastExtension(name);
  if(!ext.empty()) { ext = ext.substr(1); }

  // The global generator checks extensions of enabled languages.
  cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
  cmMakefile const* mf = this->Makefile;
  const std::vector<std::string>& srcExts = mf->GetSourceExtensions();
  const std::vector<std::string>& hdrExts = mf->GetHeaderExtensions();
  if(!gg->GetLanguageFromExtension(ext.c_str()).empty() ||
     std::find(srcExts.begin(), srcExts.end(), ext) != srcExts.end() ||
     std::find(hdrExts.begin(), hdrExts.end(), ext) != hdrExts.end())
    {
    // This is a known extension.  Use the given filename with extension.
    this->Name = cmSystemTools::GetFilenameName(name);
    this->AmbiguousExtension = false;
    }
  else
    {
    // This is not a known extension.  See if the file exists on disk as
    // named.
    std::string tryPath;
    if(this->AmbiguousDirectory)
      {
      // Check the source tree only because a file in the build tree should
      // be specified by full path at least once.  We do not want this
      // detection to depend on whether the project has already been built.
      tryPath = this->Makefile->GetCurrentSourceDirectory();
      tryPath += "/";
      }
    if(!this->Directory.empty())
      {
      tryPath += this->Directory;
      tryPath += "/";
      }
    tryPath += this->Name;
    if(cmSystemTools::FileExists(tryPath.c_str(), true))
      {
      // We found a source file named by the user on disk.  Trust it's
      // extension.
      this->Name = cmSystemTools::GetFilenameName(name);
      this->AmbiguousExtension = false;

      // If the directory was ambiguous, it isn't anymore.
      if(this->AmbiguousDirectory)
        {
        this->DirectoryUseSource();
        }
      }
    }
}